

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O3

string * ReadAll(string *__return_storage_ptr__,string *filename)

{
  string *psVar1;
  stringstream stream;
  ifstream file;
  stringstream asStack_398 [16];
  undefined1 local_388 [112];
  ios_base local_318 [264];
  undefined1 local_210 [16];
  streambuf local_200 [504];
  
  std::ifstream::ifstream(local_210,(char *)filename,_S_in);
  std::__cxx11::stringstream::stringstream(asStack_398);
  std::ostream::operator<<(local_388,local_200);
  std::ifstream::close();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_398);
  std::ios_base::~ios_base(local_318);
  psVar1 = (string *)std::ifstream::~ifstream(local_210);
  return psVar1;
}

Assistant:

static std::string ReadAll(const std::string& filename)
{
  cmsys::ifstream file(filename.c_str());
  std::stringstream stream;
  stream << file.rdbuf();
  file.close();
  return stream.str();
}